

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O0

void Tools::deque_remove_element_at_index<PhyloTreeEdge>
               (deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *c,size_t index)

{
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_RDI;
  difference_type in_stack_ffffffffffffff70;
  _Self *in_stack_ffffffffffffff78;
  const_iterator *in_stack_ffffffffffffffa0;
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_ffffffffffffffa8;
  _Deque_iterator<PhyloTreeEdge,_PhyloTreeEdge_&,_PhyloTreeEdge_*> local_50;
  _Deque_iterator<PhyloTreeEdge,PhyloTreeEdge_const&,PhyloTreeEdge_const*> local_30 [48];
  
  std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin(in_RDI);
  std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::_Deque_iterator<PhyloTreeEdge,PhyloTreeEdge_const&,PhyloTreeEdge_const*>::
  _Deque_iterator<std::_Deque_iterator<PhyloTreeEdge,PhyloTreeEdge&,PhyloTreeEdge*>,void>
            (local_30,&local_50);
  std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::erase
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  return;
}

Assistant:

static void deque_remove_element_at_index(deque<T> &c, size_t index) {
        c.erase(c.begin() + index);
    }